

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O1

bool divsufsortxx::helper::
     partition<divsufsortxx::substring::substring_wrapper<char*,bitmap::BitmapArray<long>::iterator>,bitmap::BitmapArray<long>::iterator>
               (substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> Td,iterator first1,
               iterator first2,iterator last,iterator *mfirst,iterator *mlast,value_type *v)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  pos_type pVar8;
  BitmapArray<long> *pBVar9;
  char cVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  bool bVar15;
  iterator first1_00;
  iterator first1_01;
  iterator last1;
  iterator first2_00;
  ulong local_78;
  ulong local_38;
  
  uVar14 = last.pos_;
  pBVar9 = last.array_;
  uVar12 = first2.pos_;
  last1.array_ = first2.array_;
  pVar8 = first1.pos_;
  if (uVar12 < uVar14) {
    do {
      iVar3 = (*((last1.array_)->super_Bitmap)._vptr_Bitmap[5])(last1.array_,uVar12);
      iVar3 = (*((Td.m_PA.array_)->super_Bitmap)._vptr_Bitmap[5])
                        (Td.m_PA.array_,CONCAT44(extraout_var,iVar3) + Td.m_PA.pos_);
      cVar10 = Td.m_Td[CONCAT44(extraout_var_00,iVar3)];
      uVar7 = uVar12;
      if (cVar10 != *v) break;
      uVar12 = uVar12 + 1;
      uVar7 = uVar14;
    } while (uVar14 != uVar12);
  }
  else {
    cVar10 = '\0';
    uVar7 = uVar12;
  }
  uVar12 = uVar7;
  local_38 = uVar7;
  if (((uVar7 < uVar14) && (cVar10 < *v)) && (uVar6 = uVar7 + 1, uVar12 = uVar6, uVar6 < uVar14)) {
    do {
      iVar3 = (*((last1.array_)->super_Bitmap)._vptr_Bitmap[5])(last1.array_,uVar6);
      iVar3 = (*((Td.m_PA.array_)->super_Bitmap)._vptr_Bitmap[5])
                        (Td.m_PA.array_,CONCAT44(extraout_var_01,iVar3) + Td.m_PA.pos_);
      cVar10 = Td.m_Td[CONCAT44(extraout_var_02,iVar3)];
      uVar12 = uVar6;
      local_38 = uVar7;
      if (*v < cVar10) break;
      if (cVar10 == *v) {
        local_38 = uVar7 + 1;
        iVar3 = (*((last1.array_)->super_Bitmap)._vptr_Bitmap[5])(last1.array_,uVar6);
        iVar4 = (*((last1.array_)->super_Bitmap)._vptr_Bitmap[5])(last1.array_,uVar7);
        (*((last1.array_)->super_Bitmap)._vptr_Bitmap[4])
                  (last1.array_,uVar6,CONCAT44(extraout_var_04,iVar4));
        (*((last1.array_)->super_Bitmap)._vptr_Bitmap[4])
                  (last1.array_,uVar7,CONCAT44(extraout_var_03,iVar3));
      }
      uVar6 = uVar6 + 1;
      uVar12 = uVar14;
      uVar7 = local_38;
    } while (uVar14 != uVar6);
  }
  uVar7 = uVar14 - 1;
  bVar15 = uVar12 < uVar7;
  uVar6 = uVar7;
  if (bVar15) {
    iVar3 = (*(pBVar9->super_Bitmap)._vptr_Bitmap[5])(pBVar9,uVar7);
    iVar3 = (*((Td.m_PA.array_)->super_Bitmap)._vptr_Bitmap[5])
                      (Td.m_PA.array_,CONCAT44(extraout_var_05,iVar3) + Td.m_PA.pos_);
    cVar10 = Td.m_Td[CONCAT44(extraout_var_06,iVar3)];
    if (cVar10 == *v) {
      do {
        uVar7 = uVar7 - 1;
        bVar15 = uVar12 < uVar7;
        uVar6 = uVar12;
        if (!bVar15) break;
        iVar3 = (*(pBVar9->super_Bitmap)._vptr_Bitmap[5])(pBVar9,uVar7);
        iVar3 = (*((Td.m_PA.array_)->super_Bitmap)._vptr_Bitmap[5])
                          (Td.m_PA.array_,CONCAT44(extraout_var_07,iVar3) + Td.m_PA.pos_);
        cVar10 = Td.m_Td[CONCAT44(extraout_var_08,iVar3)];
        uVar6 = uVar7;
      } while (cVar10 == *v);
    }
  }
  local_78 = uVar6;
  if ((bVar15) && (*v < cVar10)) {
    uVar7 = uVar6 - 1;
    uVar1 = uVar7;
    uVar2 = uVar6;
    for (; uVar6 = uVar1, local_78 = uVar2, uVar12 < uVar7; uVar7 = uVar7 - 1) {
      iVar3 = (*(pBVar9->super_Bitmap)._vptr_Bitmap[5])(pBVar9,uVar7);
      iVar3 = (*((Td.m_PA.array_)->super_Bitmap)._vptr_Bitmap[5])
                        (Td.m_PA.array_,CONCAT44(extraout_var_09,iVar3) + Td.m_PA.pos_);
      uVar6 = uVar7;
      if (Td.m_Td[CONCAT44(extraout_var_10,iVar3)] < *v) break;
      if (Td.m_Td[CONCAT44(extraout_var_10,iVar3)] == *v) {
        local_78 = uVar2 - 1;
        iVar3 = (*(pBVar9->super_Bitmap)._vptr_Bitmap[5])(pBVar9,uVar7);
        iVar4 = (*(pBVar9->super_Bitmap)._vptr_Bitmap[5])(pBVar9,uVar2);
        (*(pBVar9->super_Bitmap)._vptr_Bitmap[4])(pBVar9,uVar7,CONCAT44(extraout_var_12,iVar4));
        (*(pBVar9->super_Bitmap)._vptr_Bitmap[4])(pBVar9,uVar2,CONCAT44(extraout_var_11,iVar3));
      }
      uVar1 = uVar12;
      uVar2 = local_78;
    }
  }
  if (uVar12 < uVar6) {
    do {
      iVar3 = (*((last1.array_)->super_Bitmap)._vptr_Bitmap[5])(last1.array_,uVar12);
      iVar4 = (*(pBVar9->super_Bitmap)._vptr_Bitmap[5])(pBVar9,uVar6);
      (*((last1.array_)->super_Bitmap)._vptr_Bitmap[4])
                (last1.array_,uVar12,CONCAT44(extraout_var_14,iVar4));
      (*(pBVar9->super_Bitmap)._vptr_Bitmap[4])(pBVar9,uVar6,CONCAT44(extraout_var_13,iVar3));
      uVar7 = uVar12 + 1;
      uVar12 = uVar7;
      if (uVar7 < uVar6) {
        do {
          iVar3 = (*((last1.array_)->super_Bitmap)._vptr_Bitmap[5])(last1.array_,uVar7);
          iVar3 = (*((Td.m_PA.array_)->super_Bitmap)._vptr_Bitmap[5])
                            (Td.m_PA.array_,CONCAT44(extraout_var_15,iVar3) + Td.m_PA.pos_);
          uVar12 = uVar7;
          if (*v < Td.m_Td[CONCAT44(extraout_var_16,iVar3)]) break;
          if (Td.m_Td[CONCAT44(extraout_var_16,iVar3)] == *v) {
            iVar3 = (*((last1.array_)->super_Bitmap)._vptr_Bitmap[5])(last1.array_,uVar7);
            iVar4 = (*((last1.array_)->super_Bitmap)._vptr_Bitmap[5])(last1.array_,local_38);
            (*((last1.array_)->super_Bitmap)._vptr_Bitmap[4])
                      (last1.array_,uVar7,CONCAT44(extraout_var_18,iVar4));
            (*((last1.array_)->super_Bitmap)._vptr_Bitmap[4])
                      (last1.array_,local_38,CONCAT44(extraout_var_17,iVar3));
            local_38 = local_38 + 1;
          }
          uVar7 = uVar7 + 1;
          uVar12 = uVar6;
        } while (uVar6 != uVar7);
      }
      uVar7 = uVar6 - 1;
      uVar6 = uVar7;
      uVar1 = local_78;
      for (; local_78 = uVar1, uVar12 < uVar7; uVar7 = uVar7 - 1) {
        iVar3 = (*(pBVar9->super_Bitmap)._vptr_Bitmap[5])(pBVar9,uVar7);
        iVar3 = (*((Td.m_PA.array_)->super_Bitmap)._vptr_Bitmap[5])
                          (Td.m_PA.array_,CONCAT44(extraout_var_19,iVar3) + Td.m_PA.pos_);
        uVar6 = uVar7;
        if (Td.m_Td[CONCAT44(extraout_var_20,iVar3)] < *v) break;
        if (Td.m_Td[CONCAT44(extraout_var_20,iVar3)] == *v) {
          local_78 = uVar1 - 1;
          iVar3 = (*(pBVar9->super_Bitmap)._vptr_Bitmap[5])(pBVar9,uVar7);
          iVar4 = (*(pBVar9->super_Bitmap)._vptr_Bitmap[5])(pBVar9,uVar1);
          (*(pBVar9->super_Bitmap)._vptr_Bitmap[4])(pBVar9,uVar7,CONCAT44(extraout_var_22,iVar4));
          (*(pBVar9->super_Bitmap)._vptr_Bitmap[4])(pBVar9,uVar1,CONCAT44(extraout_var_21,iVar3));
        }
        uVar6 = uVar12;
        uVar1 = local_78;
      }
    } while (uVar12 < uVar6);
  }
  if (local_78 < local_38) {
    mfirst->array_ = first1.array_;
    mfirst->pos_ = pVar8;
  }
  else {
    lVar11 = uVar12 - local_38;
    lVar5 = local_38 - pVar8;
    if (lVar11 < (long)(local_38 - pVar8)) {
      lVar5 = lVar11;
    }
    first1_00.pos_ = uVar12 - lVar5;
    first1_00.array_ = last1.array_;
    last1.pos_ = uVar12;
    vecswap<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
              (first1_00,last1,first1);
    lVar13 = (local_78 - uVar12) + 1;
    lVar5 = ~local_78 + uVar14;
    if (lVar13 <= (long)(~local_78 + uVar14)) {
      lVar5 = lVar13;
    }
    first1_01.pos_ = uVar14 - lVar5;
    first1_01.array_ = pBVar9;
    first2_00.pos_ = uVar12;
    first2_00.array_ = last1.array_;
    vecswap<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
              (first1_01,last,first2_00);
    mfirst->array_ = first1.array_;
    mfirst->pos_ = lVar11 + pVar8;
    uVar14 = uVar14 - lVar13;
  }
  mlast->array_ = pBVar9;
  mlast->pos_ = uVar14;
  return local_38 <= local_78;
}

Assistant:

bool partition(
    const StringIterator_type Td, SAIterator_type first1,
    SAIterator_type first2, SAIterator_type last, SAIterator_type &mfirst,
    SAIterator_type &mlast,
    const typename std::iterator_traits<StringIterator_type>::value_type &v) {
  SAIterator_type a, b, c, d;
  typename std::iterator_traits<StringIterator_type>::value_type x = 0;

  for (b = first2; (b < last) && ((x = Td[*b]) == v); ++b) {
  }
  if (((a = b) < last) && (x < v)) {
    for (; (++b < last) && ((x = Td[*b]) <= v);) {
      if (x == v) {
        std::iter_swap(b, a++);
      }
    }
  }
  for (c = last; (b < --c) && ((x = Td[*c]) == v);) {
  }
  if ((b < (d = c)) && (x > v)) {
    for (; (b < --c) && ((x = Td[*c]) >= v);) {
      if (x == v) {
        std::iter_swap(c, d--);
      }
    }
  }
  for (; b < c;) {
    std::iter_swap(b, c);
    for (; (++b < c) && ((x = Td[*b]) <= v);) {
      if (x == v) {
        std::iter_swap(b, a++);
      }
    }
    for (; (b < --c) && ((x = Td[*c]) >= v);) {
      if (x == v) {
        std::iter_swap(c, d--);
      }
    }
  }

  if (a <= d) {
    vecswap(b - std::min(a - first1, b - a), b, first1);
    vecswap(last - std::min(d + 1 - b, last - d - 1), last, b);
    mfirst = first1 + (b - a), mlast = last - (d + 1 - b);
    return true;
  }
  mfirst = first1, mlast = last;
  return false;
}